

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O2

Result wabt::interp::Match(Limits *expected,Limits *actual,string *out_msg)

{
  char *pcVar1;
  string local_30;
  
  if (actual->initial < expected->initial) {
    pcVar1 = "actual size (%lu) smaller than declared (%lu)";
LAB_0016a206:
    StringPrintf_abi_cxx11_(&local_30,pcVar1);
  }
  else {
    if (expected->has_max == true) {
      if (actual->has_max == false) {
        StringPrintf_abi_cxx11_
                  (&local_30,"max size (unspecified) larger than declared (%lu)",expected->max);
        goto LAB_0016a289;
      }
      if (expected->max < actual->max) {
        pcVar1 = "max size (%lu) larger than declared (%lu)";
        goto LAB_0016a206;
      }
    }
    if (expected->is_64 == true) {
      if (actual->is_64 != false) {
        return (Result)Ok;
      }
      pcVar1 = "expected i64 memory, but i32 memory provided";
    }
    else {
      if (actual->is_64 == false) {
        return (Result)Ok;
      }
      pcVar1 = "expected i32 memory, but i64 memory provided";
    }
    StringPrintf_abi_cxx11_(&local_30,pcVar1);
  }
LAB_0016a289:
  std::__cxx11::string::operator=((string *)out_msg,(string *)&local_30);
  std::__cxx11::string::_M_dispose();
  return (Result)Error;
}

Assistant:

Result Match(const Limits& expected,
             const Limits& actual,
             std::string* out_msg) {
  if (actual.initial < expected.initial) {
    *out_msg = StringPrintf("actual size (%" PRIu64
                            ") smaller than declared (%" PRIu64 ")",
                            actual.initial, expected.initial);
    return Result::Error;
  }

  if (expected.has_max) {
    if (!actual.has_max) {
      *out_msg = StringPrintf(
          "max size (unspecified) larger than declared (%" PRIu64 ")",
          expected.max);
      return Result::Error;
    } else if (actual.max > expected.max) {
      *out_msg = StringPrintf("max size (%" PRIu64
                              ") larger than declared (%" PRIu64 ")",
                              actual.max, expected.max);
      return Result::Error;
    }
  }

  if (expected.is_64 && !actual.is_64) {
    *out_msg = StringPrintf("expected i64 memory, but i32 memory provided");
    return Result::Error;
  } else if (actual.is_64 && !expected.is_64) {
    *out_msg = StringPrintf("expected i32 memory, but i64 memory provided");
    return Result::Error;
  }

  return Result::Ok;
}